

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.cpp
# Opt level: O2

void __thiscall
OpenMD::Torsion::Torsion
          (Torsion *this,Atom *atom1,Atom *atom2,Atom *atom3,Atom *atom4,TorsionType *tt)

{
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *this_00;
  
  ShortRangeInteraction::ShortRangeInteraction(&this->super_ShortRangeInteraction);
  (this->super_ShortRangeInteraction)._vptr_ShortRangeInteraction =
       (_func_int **)&PTR__Torsion_002c7b78;
  this->torsionType_ = tt;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this_00 = &(this->super_ShortRangeInteraction).atoms_;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::resize(this_00,4);
  *(this_00->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
   super__Vector_impl_data._M_start = atom1;
  (this_00->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
  super__Vector_impl_data._M_start[1] = atom2;
  (this_00->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = atom3;
  (this_00->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
  super__Vector_impl_data._M_start[3] = atom4;
  return;
}

Assistant:

Torsion::Torsion(Atom* atom1, Atom* atom2, Atom* atom3, Atom* atom4,
                   TorsionType* tt) :
      ShortRangeInteraction(),
      torsionType_(tt) {
    atoms_.resize(4);
    atoms_[0] = atom1;
    atoms_[1] = atom2;
    atoms_[2] = atom3;
    atoms_[3] = atom4;
  }